

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 03_signal_epoll.c
# Opt level: O3

void setup_signals(int argc,char **argv)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  epoll_data_t *peVar4;
  char **argv_00;
  int iVar5;
  char *__s;
  sigaction sa;
  _union_1457 local_a8;
  sigset_t local_a0;
  undefined4 local_20;
  
  if (1 < argc) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    lVar3 = strtol(argv[1],(char **)0x0,10);
    if (*piVar2 == 0) {
      if (lVar3 == 0) goto LAB_001014ea;
      printf("Alarm after %ld seconds.\n",lVar3);
      sigemptyset(&local_a0);
      local_20 = 0x10000000;
      local_a8.sa_handler = sigalrm_handler;
      iVar1 = sigaction(0xe,(sigaction *)&local_a8,(sigaction *)0x0);
      if (iVar1 != -1) {
        alarm((uint)lVar3);
        return;
      }
    }
    else {
      setup_signals_cold_1();
    }
    setup_signals_cold_2();
    iVar1 = 0;
    epollfd = epoll_create1(0);
    if (epollfd != -1) {
      return;
    }
    setup_epoll_cold_1();
    ev.events = 1;
    argv_00 = (char **)0x1;
    iVar5 = epollfd;
    ev.data.fd = iVar1;
    iVar1 = epoll_ctl(epollfd,1,iVar1,(epoll_event *)&ev);
    if (iVar1 != -1) {
      return;
    }
    add_fd_to_epoll_cold_1();
    setup_signals(iVar5,argv_00);
    setup_epoll();
    add_fd_to_epoll(0);
    listen_sock = setup_listening_socket(5000);
    add_fd_to_epoll(listen_sock);
    nfds = epoll_wait(epollfd,(epoll_event *)events,10,-1);
    do {
      if (nfds == -1) {
        __s = "epoll_wait()";
LAB_0010169e:
        perror(__s);
        exit(1);
      }
      if (0 < nfds) {
        peVar4 = &events[0].data;
        lVar3 = 0;
        do {
          iVar1 = peVar4->fd;
          if (iVar1 == 0) {
            puts("stdin ready..");
            iVar1 = 0;
            iVar5 = 1;
LAB_0010161e:
            copy_fd(iVar1,iVar5);
          }
          else {
            if (iVar1 == conn_sock) {
              puts("socket data ready..");
              iVar1 = conn_sock;
              iVar5 = conn_sock;
              goto LAB_0010161e;
            }
            if (iVar1 == listen_sock) {
              puts("new connection ready..");
              conn_sock = accept(listen_sock,(sockaddr *)0x0,(socklen_t *)0x0);
              if (conn_sock == -1) {
                __s = "accept()";
                goto LAB_0010169e;
              }
              add_fd_to_epoll(conn_sock);
            }
          }
          lVar3 = lVar3 + 1;
          peVar4 = (epoll_data_t *)(&peVar4->fd + 3);
        } while (lVar3 < nfds);
      }
      nfds = epoll_wait(epollfd,(epoll_event *)events,10,-1);
    } while( true );
  }
LAB_001014ea:
  puts("No alarm set. Will not be interrupted.");
  return;
}

Assistant:

void setup_signals(int argc, char **argv) {
    struct sigaction sa;

    /* No argument passed, and so no signal will be delivered */
    if (argc < 2) {
        printf("No alarm set. Will not be interrupted.\n");
        return;
    }

    /*  if a proper number is passed, we setup the alarm,
     * else we return without setting one up.
     * */
    errno = 0;
    long alarm_after = strtol(argv[1], NULL, 10);
    if (errno)
        handle_error("strtol()");
    if (alarm_after)
        printf("Alarm after %ld seconds.\n", alarm_after);
    else {
        printf("No alarm set. Will not be interrupted.\n");
        return;
    }

    /*
     * Setup a signal handler for the SIGALRM signal
     * */
    sigemptyset(&sa.sa_mask);
    sa.sa_flags = SA_RESTART;
    sa.sa_handler = sigalrm_handler;
    if (sigaction(SIGALRM, &sa, NULL) == -1)
        handle_error("sigaction");

    /*
     * Let's send ourselves a SIGALRM signal specified
     * seconds later.
     * */
    alarm(alarm_after);
}